

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O3

int rndtrap(level *lev)

{
  boolean bVar1;
  uint uVar2;
  
  do {
    uVar2 = mt_random();
    switch(uVar2 % 0x18) {
    case 2:
    case 6:
      if ((lev->z).dnum != dungeon_topology.d_astral_level.dnum) goto switchD_00255eb8_caseD_3;
      break;
    default:
      goto switchD_00255eb8_caseD_3;
    case 0xc:
    case 0xe:
    case 0x11:
      break;
    case 0xd:
      bVar1 = can_dig_down(lev);
      if (bVar1 != '\0') goto switchD_00255eb8_caseD_3;
      break;
    case 0xf:
    case 0x10:
      if (((lev->flags).field_0x9 & 8) == 0) {
switchD_00255eb8_caseD_3:
        return uVar2 % 0x18 + 1;
      }
    }
  } while( true );
}

Assistant:

static int rndtrap(struct level *lev)
{
	int rtrap;

	do {
	    rtrap = rnd(TRAPNUM-1);
	    switch (rtrap) {
	     case HOLE:		/* no random holes on special levels */
             case VIBRATING_SQUARE:
	     case MAGIC_PORTAL:	rtrap = NO_TRAP;
				break;
	     case TRAPDOOR:	if (!can_dig_down(lev)) rtrap = NO_TRAP;
				break;
	     case LEVEL_TELEP:
	     case TELEP_TRAP:	if (lev->flags.noteleport) rtrap = NO_TRAP;
				break;
	     case ROLLING_BOULDER_TRAP:
	     case ROCKTRAP:	if (In_endgame(&lev->z)) rtrap = NO_TRAP;
				break;
	    }
	} while (rtrap == NO_TRAP);
	return rtrap;
}